

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

InternalParseResult * __thiscall
Catch::Clara::Arg::parse
          (InternalParseResult *__return_storage_ptr__,Arg *this,string *param_1,TokenStream *tokens
          )

{
  element_type *peVar1;
  int iVar2;
  ParserResult result;
  TokenStream remainingTokens;
  Result validationResult;
  undefined1 local_108 [16];
  _Alloc_hider _Stack_f8;
  undefined1 local_f0 [8];
  undefined1 local_e8 [32];
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_c8;
  Token local_a8;
  BasicResult<void> local_80;
  ParseResultType local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_40;
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_38;
  
  (*(this->super_ParserRefImpl<Catch::Clara::Arg>).super_ComposableParserImpl<Catch::Clara::Arg>.
    super_ParserBase._vptr_ParserBase[2])(&local_80);
  if (local_80.super_ResultValueBase<void>.super_ResultBase.m_type == Ok) {
    local_e8._16_8_ = (tokens->it)._M_current;
    local_e8._24_8_ = (tokens->itEnd)._M_current;
    std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::vector
              (&local_c8,&tokens->m_tokenBuffer);
    Detail::TokenStream::operator*(&local_a8,(TokenStream *)(local_e8 + 0x10));
    if (local_a8.type == Argument) {
      iVar2 = (*((this->super_ParserRefImpl<Catch::Clara::Arg>).m_ref.
                 super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_BoundRef[3])();
      if ((char)iVar2 != '\0') {
        __assert_fail("!m_ref->isFlag()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.cpp"
                      ,0xa24,
                      "virtual Detail::InternalParseResult Catch::Clara::Arg::parse(const std::string &, const Detail::TokenStream &) const"
                     );
      }
      if (local_c8.
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_c8.
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("!m_tokenBuffer.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                      ,0x11d3,"const Token *Catch::Clara::Detail::TokenStream::operator->() const");
      }
      peVar1 = (this->super_ParserRefImpl<Catch::Clara::Arg>).m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (*peVar1->_vptr_BoundRef[4])
                (local_108,peVar1,
                 &(local_c8.
                   super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                   ._M_impl.super__Vector_impl_data._M_start)->token);
      if (local_108._8_4_ == Ok) {
        Detail::TokenStream::operator++((TokenStream *)(local_e8 + 0x10));
        local_50 = Matched;
        local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_e8._16_8_;
        pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_e8._24_8_;
        std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
        vector(&local_38,&local_c8);
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase.m_type = Ok;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_00246f20;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_type = local_50;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current = local_48;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current = pbStack_40;
        std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
        vector(&(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
                field_0.m_value.m_remainingTokens.m_tokenBuffer,&local_38);
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00246ec8;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
        (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
        (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
        std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
        ~vector(&local_38);
      }
      else {
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::
        BasicResult<Catch::Clara::ParseResultType>
                  (__return_storage_ptr__,(BasicResult<Catch::Clara::ParseResultType> *)local_108);
      }
      local_108._0_8_ = &PTR__BasicResult_00246fb8;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_f8._M_p !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8) {
        operator_delete(_Stack_f8._M_p,local_e8._0_8_ + 1);
      }
    }
    else {
      local_108._0_4_ = 1;
      local_108._8_8_ = local_e8._16_8_;
      _Stack_f8._M_p = (pointer)local_e8._24_8_;
      std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::vector
                ((vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                  *)local_f0,&local_c8);
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase.m_type = Ok;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_00246f20;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_type = local_108._0_4_;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_remainingTokens.it._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._8_8_;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_remainingTokens.itEnd._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_f8._M_p;
      std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::vector
                (&(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
                  field_0.m_value.m_remainingTokens.m_tokenBuffer,
                 (vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                  *)local_f0);
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00246ec8;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
      (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
      std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
      ~vector((vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *)
              local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.token._M_dataplus._M_p != &local_a8.token.field_2) {
      operator_delete(local_a8.token._M_dataplus._M_p,
                      local_a8.token.field_2._M_allocated_capacity + 1);
    }
    std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::~vector
              (&local_c8);
  }
  else {
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&local_80);
  }
  local_80.super_ResultValueBase<void>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_00247038;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_errorMessage._M_dataplus._M_p != &local_80.m_errorMessage.field_2) {
    operator_delete(local_80.m_errorMessage._M_dataplus._M_p,
                    local_80.m_errorMessage.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult Arg::parse(std::string const&,
                                               Detail::TokenStream const& tokens) const {
            auto validationResult = validate();
            if (!validationResult)
                return Detail::InternalParseResult(validationResult);

            auto remainingTokens = tokens;
            auto const& token = *remainingTokens;
            if (token.type != Detail::TokenType::Argument)
                return Detail::InternalParseResult::ok(Detail::ParseState(
                    ParseResultType::NoMatch, remainingTokens));

            assert(!m_ref->isFlag());
            auto valueRef =
                static_cast<Detail::BoundValueRefBase*>(m_ref.get());

            auto result = valueRef->setValue(remainingTokens->token);
            if (!result)
                return Detail::InternalParseResult(result);
            else
                return Detail::InternalParseResult::ok(Detail::ParseState(
                    ParseResultType::Matched, ++remainingTokens));
        }